

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encodemb.c
# Opt level: O3

void av1_xform_dc_only(MACROBLOCK *x,int plane,int block,TxfmParam *txfm_param,int64_t per_px_mean)

{
  tran_low_t *__s;
  byte bVar1;
  size_t __n;
  
  bVar1 = txfm_param->tx_size;
  if (((0xc < bVar1) || (__n = 0x1000, (0x1810U >> (bVar1 & 0x1f) & 1) == 0)) &&
     (__n = 0x800, 1 < (byte)(bVar1 - 0x11))) {
    __n = (long)tx_size_2d[bVar1] << 2;
  }
  __s = x->plane[plane].coeff + (block << 4);
  memset(__s,0,__n);
  *__s = (tran_low_t)((ulong)dc_coeff_scale[txfm_param->tx_size] * per_px_mean >> 0xc);
  return;
}

Assistant:

void av1_xform_dc_only(MACROBLOCK *x, int plane, int block,
                       TxfmParam *txfm_param, int64_t per_px_mean) {
  assert(per_px_mean != INT64_MAX);
  const struct macroblock_plane *const p = &x->plane[plane];
  const int block_offset = BLOCK_OFFSET(block);
  tran_low_t *const coeff = p->coeff + block_offset;
  const int n_coeffs = av1_get_max_eob(txfm_param->tx_size);
  memset(coeff, 0, sizeof(*coeff) * n_coeffs);
  coeff[0] =
      (tran_low_t)((per_px_mean * dc_coeff_scale[txfm_param->tx_size]) >> 12);
}